

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_initCStream_usingDict(ZSTD_CStream *zcs,void *dict,size_t dictSize,int compressionLevel)

{
  uint uVar1;
  size_t err_code_2;
  size_t err_code_1;
  size_t err_code;
  int compressionLevel_local;
  size_t dictSize_local;
  void *dict_local;
  ZSTD_CStream *zcs_local;
  
  zcs_local = (ZSTD_CStream *)ZSTD_CCtx_reset(zcs,ZSTD_reset_session_only);
  uVar1 = ERR_isError((size_t)zcs_local);
  if (uVar1 == 0) {
    zcs_local = (ZSTD_CStream *)ZSTD_CCtx_setParameter(zcs,ZSTD_c_compressionLevel,compressionLevel)
    ;
    uVar1 = ERR_isError((size_t)zcs_local);
    if (uVar1 == 0) {
      zcs_local = (ZSTD_CStream *)ZSTD_CCtx_loadDictionary(zcs,dict,dictSize);
      uVar1 = ERR_isError((size_t)zcs_local);
      if (uVar1 == 0) {
        zcs_local = (ZSTD_CStream *)0x0;
      }
    }
  }
  return (size_t)zcs_local;
}

Assistant:

size_t ZSTD_initCStream_usingDict(ZSTD_CStream* zcs, const void* dict, size_t dictSize, int compressionLevel)
{
    DEBUGLOG(4, "ZSTD_initCStream_usingDict");
    FORWARD_IF_ERROR( ZSTD_CCtx_reset(zcs, ZSTD_reset_session_only) );
    FORWARD_IF_ERROR( ZSTD_CCtx_setParameter(zcs, ZSTD_c_compressionLevel, compressionLevel) );
    FORWARD_IF_ERROR( ZSTD_CCtx_loadDictionary(zcs, dict, dictSize) );
    return 0;
}